

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloexec.c
# Opt level: O0

void cloexec(int fd)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  int fdflags;
  int fd_local;
  
  uVar2 = fcntl(fd,1);
  pFVar1 = _stderr;
  if ((int)uVar2 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"%d: fcntl(F_GETFD): %s\n",(ulong)(uint)fd,pcVar5);
    exit(1);
  }
  iVar3 = fcntl(fd,2,(ulong)(uVar2 | 1));
  pFVar1 = _stderr;
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"%d: fcntl(F_SETFD): %s\n",(ulong)(uint)fd,pcVar5);
    exit(1);
  }
  return;
}

Assistant:

void cloexec(int fd)
{
    int fdflags;

    fdflags = fcntl(fd, F_GETFD);
    if (fdflags < 0) {
        fprintf(stderr, "%d: fcntl(F_GETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
    if (fcntl(fd, F_SETFD, fdflags | FD_CLOEXEC) < 0) {
        fprintf(stderr, "%d: fcntl(F_SETFD): %s\n", fd, strerror(errno));
        exit(1);
    }
}